

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

void __thiscall
PartiallySignedTransaction::PartiallySignedTransaction
          (PartiallySignedTransaction *this,CMutableTransaction *tx)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::_Optional_payload_base<CMutableTransaction>::_Storage<CMutableTransaction,false>::
  _Storage<CMutableTransaction_const&>();
  (this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_engaged = true;
  p_Var1 = &(this->m_xpubs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->unknown)._M_t._M_impl.super__Rb_tree_header;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  p_Var1 = &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::resize
            (&this->inputs,
             ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::resize
            (&this->outputs,
             ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PartiallySignedTransaction::PartiallySignedTransaction(const CMutableTransaction& tx) : tx(tx)
{
    inputs.resize(tx.vin.size());
    outputs.resize(tx.vout.size());
}